

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O1

bool anon_unknown.dwarf_55dd6::SetVoiceOffset
               (Voice *oldvoice,VoicePos *vpos,ALsource *source,ALCcontext *context,
               ALCdevice *device)

{
  VoiceChange *pVVar1;
  __int_type_conflict2 _Var2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ALuint AVar6;
  VoiceChange *tail;
  Voice *voice;
  Voice *pVVar7;
  bool bVar8;
  
  _Var2 = (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i;
  if (_Var2 == 0) {
    AVar6 = 0;
    voice = (Voice *)0x0;
  }
  else {
    AVar6 = 0;
    lVar5 = 8;
    pVVar7 = (Voice *)0x0;
    do {
      voice = *(Voice **)((long)&((context->mVoices)._M_b._M_p)->mSize + lVar5);
      if ((((voice->mPlayState)._M_i != Stopped) ||
          ((voice->mSourceID).super___atomic_base<unsigned_int>._M_i != 0)) ||
         (bVar8 = true, ((voice->mPendingChange)._M_base._M_i & 1U) != 0)) {
        AVar6 = AVar6 + 1;
        bVar8 = false;
        voice = pVVar7;
      }
    } while ((!bVar8) && (lVar3 = _Var2 * 8 - lVar5, lVar5 = lVar5 + 8, pVVar7 = voice, lVar3 != 0))
    ;
  }
  if (voice == (Voice *)0x0) {
    if (((context->mVoices)._M_b._M_p)->mSize == _Var2) {
      ALCcontext::allocVoices(context,1);
    }
    LOCK();
    (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i =
         (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    _Var2 = (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i;
    if (_Var2 == 0) {
      AVar6 = 0;
    }
    else {
      AVar6 = 0;
      lVar5 = 8;
      pVVar7 = voice;
      do {
        voice = *(Voice **)((long)&((context->mVoices)._M_b._M_p)->mSize + lVar5);
        if ((((voice->mPlayState)._M_i != Stopped) ||
            ((voice->mSourceID).super___atomic_base<unsigned_int>._M_i != 0)) ||
           (bVar8 = true, ((voice->mPendingChange)._M_base._M_i & 1U) != 0)) {
          AVar6 = AVar6 + 1;
          bVar8 = false;
          voice = pVVar7;
        }
      } while ((!bVar8) && (bVar8 = _Var2 << 3 != lVar5, lVar5 = lVar5 + 8, pVVar7 = voice, bVar8));
    }
  }
  (voice->mPlayState)._M_i = Pending;
  (voice->mPosition).super___atomic_base<unsigned_int>._M_i = vpos->pos;
  (voice->mPositionFrac).super___atomic_base<unsigned_int>._M_i = vpos->frac;
  (voice->mCurrentBuffer)._M_b._M_p = vpos->bufferitem;
  uVar4 = 0x10;
  if (vpos->frac == 0 && vpos->pos == 0) {
    uVar4 = (uint)(vpos->bufferitem != source->queue) << 4;
  }
  voice->mFlags = uVar4;
  InitVoice(voice,source,source->queue,context,device);
  source->VoiceIdx = AVar6;
  (oldvoice->mPendingChange)._M_base._M_i = true;
  tail = context->mVoiceChangeTail;
  if (tail == (context->mCurrentVoiceChange)._M_b._M_p) {
    ALCcontext::allocVoiceChanges(context,1);
    tail = context->mVoiceChangeTail;
  }
  LOCK();
  pVVar1 = (tail->mNext)._M_b._M_p;
  (tail->mNext)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  context->mVoiceChangeTail = pVVar1;
  tail->mOldVoice = oldvoice;
  tail->mVoice = voice;
  tail->mSourceID = source->id;
  tail->mState = 0x1025;
  SendVoiceChanges(context,tail);
  bVar8 = true;
  if (((oldvoice->mSourceID).super___atomic_base<unsigned_int>._M_i == 0) &&
     ((voice->mPlayState)._M_i == Pending)) {
    do {
    } while (((device->MixCount).super___atomic_base<unsigned_int>._M_i & 1) != 0);
    if ((voice->mPlayState)._M_i == Pending) {
      (voice->mCurrentBuffer)._M_b._M_p = (__pointer_type)0x0;
      (voice->mLoopBuffer)._M_b._M_p = (__pointer_type)0x0;
      (voice->mSourceID).super___atomic_base<unsigned_int>._M_i = 0;
      (voice->mPlayState)._M_i = Stopped;
      bVar8 = false;
    }
  }
  return bVar8;
}

Assistant:

bool SetVoiceOffset(Voice *oldvoice, const VoicePos &vpos, ALsource *source, ALCcontext *context,
    ALCdevice *device)
{
    /* First, get a free voice to start at the new offset. */
    auto voicelist = context->getVoicesSpan();
    Voice *newvoice{};
    ALuint vidx{0};
    for(Voice *voice : voicelist)
    {
        if(voice->mPlayState.load(std::memory_order_acquire) == Voice::Stopped
            && voice->mSourceID.load(std::memory_order_relaxed) == 0u
            && voice->mPendingChange.load(std::memory_order_relaxed) == false)
        {
            newvoice = voice;
            break;
        }
        ++vidx;
    }
    if UNLIKELY(!newvoice)
    {
        auto &allvoices = *context->mVoices.load(std::memory_order_relaxed);
        if(allvoices.size() == voicelist.size())
            context->allocVoices(1);
        context->mActiveVoiceCount.fetch_add(1, std::memory_order_release);
        voicelist = context->getVoicesSpan();

        vidx = 0;
        for(Voice *voice : voicelist)
        {
            if(voice->mPlayState.load(std::memory_order_acquire) == Voice::Stopped
                && voice->mSourceID.load(std::memory_order_relaxed) == 0u
                && voice->mPendingChange.load(std::memory_order_relaxed) == false)
            {
                newvoice = voice;
                break;
            }
            ++vidx;
        }
    }